

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Smf.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
rlib::midi::Smf::getFileImage
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,Smf *this)

{
  _List_node_base **pp_Var1;
  size_t sVar2;
  vector<unsigned_char,std::allocator<unsigned_char>> *this_00;
  _Rb_tree_node_base *p_Var3;
  _List_node_base *p_Var4;
  size_t position;
  shared_ptr<const_rlib::midi::EventMeta> meta;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  Event e;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result;
  list<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  trackData;
  anon_class_16_2_cffccc38 fEvent;
  size_t local_f8;
  undefined1 local_f0 [10];
  unsigned_short uStack_e6;
  unsigned_short local_e4 [14];
  const_iterator local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  Event local_b0;
  undefined1 local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_88;
  Smf *local_80;
  _List_node_base *local_78;
  _List_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_70;
  __shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2> local_58;
  anon_class_16_2_cffccc38 local_40;
  
  local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
  local_70._M_impl._M_node._M_size = 0;
  p_Var4 = (_List_node_base *)&this->tracks;
  local_88 = (vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__;
  local_80 = this;
  local_78 = p_Var4;
  local_70._M_impl._M_node.super__List_node_base._M_prev =
       local_70._M_impl._M_node.super__List_node_base._M_next;
  do {
    p_Var4 = (((_List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_> *)
              &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == local_78) {
      local_f0._0_8_ = (_func_int **)0x66468544d;
      stack0xffffffffffffff18 =
           CONCAT22((short)local_70._M_impl._M_node._M_size,
                    (ushort)((local_70._M_impl._M_node._M_size & 0xfffe) != 0));
      local_e4[0] = (short)local_80->timeBase;
      Inner::changeEndian<unsigned_int>((uint *)(local_f0 + 4));
      Inner::changeEndian<unsigned_short>((unsigned_short *)(local_f0 + 8));
      Inner::changeEndian<unsigned_short>(&uStack_e6);
      Inner::changeEndian<unsigned_short>(local_e4);
      this_00 = local_88;
      local_b0.position = local_f0._0_8_;
      local_b0.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
      _4_2_ = (undefined2)local_e4._0_4_;
      local_b0.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
      _0_4_ = stack0xffffffffffffff18;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                (local_88,(uchar *)&local_b0,
                 (uchar *)((long)&local_b0.event.
                                  super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 6),(allocator_type *)local_f0);
      p_Var4 = (_List_node_base *)&local_70;
      while (p_Var4 = (((_List_impl *)&p_Var4->_M_next)->_M_node).super__List_node_base._M_next,
            p_Var4 != (_List_node_base *)&local_70) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<std::move_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
                  (this_00,(const_iterator)*(uchar **)(this_00 + 8),
                   (move_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    )p_Var4[1]._M_next,
                   (move_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    )p_Var4[1]._M_prev);
      }
      std::__cxx11::
      _List_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::_M_clear(&local_70);
      return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00;
    }
    local_b8 = 0;
    local_c8._M_current = (uchar *)0x0;
    uStack_c0 = 0;
    local_f8 = 0;
    pp_Var1 = &p_Var4[1]._M_prev;
    local_40.position = &local_f8;
    local_40.v = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8;
    for (p_Var3 = (_Rb_tree_node_base *)p_Var4[2]._M_prev; p_Var3 != (_Rb_tree_node_base *)pp_Var1;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      getFileImage::anon_class_16_2_cffccc38::operator()(&local_40,(Event *)(p_Var3 + 1));
    }
    if ((_List_node_base *)pp_Var1 == p_Var4[2]._M_prev) {
LAB_0014939b:
      sVar2 = local_f8;
      EventMeta::createEndOfTrack();
      std::make_shared<rlib::midi::EventMeta,rlib::midi::EventMeta>((EventMeta *)local_98);
      local_58._M_ptr = (element_type *)local_98;
      local_58._M_refcount._M_pi = _Stack_90._M_pi;
      local_98 = (undefined1  [8])0x0;
      _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_b0.position = sVar2;
      std::__shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_b0.event.
                  super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>,&local_58)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_90);
      EventMeta::~EventMeta((EventMeta *)local_f0);
      getFileImage::anon_class_16_2_cffccc38::operator()(&local_40,&local_b0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_b0.event.
                  super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      std::_Rb_tree_decrement((_Rb_tree_node_base *)pp_Var1);
      std::dynamic_pointer_cast<rlib::midi::EventMeta_const,rlib::midi::Event_const>
                ((shared_ptr<const_rlib::midi::Event> *)local_f0);
      if (((_func_int **)local_f0._0_8_ == (_func_int **)0x0) ||
         (*(int *)(local_f0._0_8_ + 8) != 0x2f)) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
        goto LAB_0014939b;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
    }
    local_f0._4_4_ = (int)uStack_c0 - (int)local_c8._M_current;
    local_f0._0_4_ = 0x6b72544d;
    Inner::changeEndian<unsigned_int>((uint *)(local_f0 + 4));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c8,local_c8,
               (uchar *)local_f0,local_f0 + 8);
    std::__cxx11::
    list<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
    ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((list<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                *)&local_70,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8);
  } while( true );
}

Assistant:

std::vector<uint8_t> Smf::getFileImage() const
{
	std::list<std::vector<uint8_t>> trackData;

	for (auto& track : tracks) {
		std::vector<uint8_t> v;

		size_t position = 0;		// 現在位置

		auto fEvent = [&](const Event& event) {

			{// DeltaTime
				assert(event.position >= position);
				const size_t deltaTime = event.position - position;		// DeltaTime
				position = event.position;								// 現在位置更新
				std::vector<uint8_t> s = midi::inner::getVariableValue(deltaTime);
				v.insert(v.end(), std::make_move_iterator(s.begin()), std::make_move_iterator(s.end()));
			}

			{
				std::vector<uint8_t> t = event.event->midiMessage();
				v.insert(v.end(), std::make_move_iterator(t.begin()), std::make_move_iterator(t.end()));
			}

		};

		for (auto& event : track.events) {
			fEvent(event);
		}

		// EndOfTrackがなければ付ける
		[&] {
			if (auto i = track.events.rbegin(); i != track.events.rend()) {		// 末尾が EndOfTrack ではないなら
				if (auto meta = std::dynamic_pointer_cast<const midi::EventMeta>(i->event)) {
					if (meta->type == midi::EventMeta::Type::endOfTrack) {
						return;
					}
				}
			}
			Event e(position, std::make_shared<midi::EventMeta>(midi::EventMeta::createEndOfTrack()));
			fEvent(e);
		}();

		{// TrackChunk を先頭に挿入
			Inner::TrackChunk trackChunk;
			trackChunk.dataLength = static_cast<uint32_t>(v.size());
			Inner::changeEndian(trackChunk.dataLength);
			v.insert(v.begin(),
				reinterpret_cast<const uint8_t*>(&trackChunk),
				reinterpret_cast<const uint8_t*>(&trackChunk) + sizeof(trackChunk));
		}

		trackData.emplace_back(std::move(v));
	}

	const Inner::HeaderChunk headerChunk = [&] {
		Inner::HeaderChunk h;
		h.trackCount = static_cast<uint16_t>(trackData.size());
		h.format = h.trackCount > 1 ? 1 : 0;
		h.division = timeBase;
		// エンディアン変更
		Inner::changeEndian(h.dataLength);
		Inner::changeEndian(h.format);
		Inner::changeEndian(h.trackCount);
		Inner::changeEndian(h.division);
		return h;
	}();

	std::vector<uint8_t> result(
		reinterpret_cast<const uint8_t*>(&headerChunk),
		reinterpret_cast<const uint8_t*>(&headerChunk) + sizeof(headerChunk));

	for (auto& i : trackData) {
		result.insert(result.end(), std::make_move_iterator(i.begin()), std::make_move_iterator(i.end()));
	}

	return result;
}